

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFS.hpp
# Opt level: O0

int webfront::fs::IndexFS::open(char *__file,int __oflag,...)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  string filename;
  undefined5 in_stack_fffffffffffff858;
  undefined1 in_stack_fffffffffffff85d;
  undefined1 in_stack_fffffffffffff85e;
  undefined1 in_stack_fffffffffffff85f;
  File *this;
  path *in_stack_fffffffffffff888;
  File local_520;
  undefined4 local_2c8;
  File local_2c0;
  undefined8 local_10;
  char *local_8;
  
  this = (File *)__file;
  local_10 = ___oflag;
  local_8 = __file;
  std::filesystem::__cxx11::path::relative_path();
  http::std::filesystem::__cxx11::path::string(in_stack_fffffffffffff888);
  http::std::filesystem::__cxx11::path::~path((path *)this);
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                          (char *)CONCAT17(in_stack_fffffffffffff85f,
                                           CONCAT16(in_stack_fffffffffffff85e,
                                                    CONCAT15(in_stack_fffffffffffff85d,
                                                             in_stack_fffffffffffff858))));
  if ((bool)uVar1) {
    File::File<webfront::fs::IndexFS::IndexHtml>(&local_2c0);
    http::std::optional<webfront::fs::File>::optional<webfront::fs::File,_true>
              ((optional<webfront::fs::File> *)this,
               (File *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff85e,
                                               CONCAT15(in_stack_fffffffffffff85d,
                                                        in_stack_fffffffffffff858))));
    File::~File(this);
  }
  else {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,(char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff85e,
                                                                 CONCAT15(in_stack_fffffffffffff85d,
                                                                          in_stack_fffffffffffff858)
                                                                )));
    if ((bool)uVar2) {
      File::File<webfront::fs::IndexFS::WebFrontIco>(&local_520);
      http::std::optional<webfront::fs::File>::optional<webfront::fs::File,_true>
                ((optional<webfront::fs::File> *)this,
                 (File *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffff85d,
                                                                in_stack_fffffffffffff858))));
      File::~File(this);
    }
    else {
      uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this,(char *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(
                                                  in_stack_fffffffffffff85d,
                                                  in_stack_fffffffffffff858))));
      if ((bool)uVar3) {
        File::File<webfront::fs::IndexFS::WebFrontJs>((File *)&stack0xfffffffffffff880);
        http::std::optional<webfront::fs::File>::optional<webfront::fs::File,_true>
                  ((optional<webfront::fs::File> *)this,
                   (File *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,in_stack_fffffffffffff858)))
                  );
        File::~File(this);
      }
      else {
        http::std::optional<webfront::fs::File>::optional((optional<webfront::fs::File> *)0x12cfcf);
      }
    }
  }
  local_2c8 = 1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return (int)__file;
}

Assistant:

static std::optional<File> open(std::filesystem::path file) {
        auto filename = file.relative_path().string();
        if (filename == "index.html") return File(IndexHtml{});
        if (filename == "favicon.ico") return File{WebFrontIco{}};
        if (filename == "WebFront.js") return File{WebFrontJs{}};
        return {};
    }